

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# p_lnspec.cpp
# Opt level: O0

int LS_ACS_ExecuteWithResult
              (line_t *ln,AActor *it,bool backSide,int arg0,int arg1,int arg2,int arg3,int arg4)

{
  int iVar1;
  char *map;
  int local_38;
  int flags;
  int args [4];
  int arg2_local;
  int arg1_local;
  int arg0_local;
  bool backSide_local;
  AActor *it_local;
  line_t *ln_local;
  
  args[0] = arg3;
  args[1] = arg4;
  local_38 = arg1;
  flags = arg2;
  args[2] = arg2;
  args[3] = arg1;
  map = FString::operator_cast_to_char_(&level.MapName);
  iVar1 = P_StartScript(it,(line_t_conflict *)ln,arg0,map,&local_38,4,backSide | 6);
  return iVar1;
}

Assistant:

FUNC(LS_ACS_ExecuteWithResult)
// ACS_ExecuteWithResult (script, s_arg1, s_arg2, s_arg3, s_arg4)
{
	// This is like ACS_ExecuteAlways, except the script is always run on
	// the current map, and the return value is whatever the script sets
	// with SetResultValue.
	int args[4] = { arg1, arg2, arg3, arg4 };
	int flags = (backSide ? ACS_BACKSIDE : 0) | ACS_ALWAYS | ACS_WANTRESULT;

	return P_StartScript (it, ln, arg0, level.MapName, args, 4, flags);
}